

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreCacheHandler.h
# Opt level: O1

void __thiscall
irr::video::
COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
::setColorMask(COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
               *this,u8 mask)

{
  ulong uVar1;
  
  if ((*this->ColorMask != mask) || (this->ColorMaskInvalid == true)) {
    (*GL.ColorMask)(mask >> 1 & 1,mask >> 2 & 1,mask >> 3 & 1,mask & 1);
    if (this->FrameBufferCount != 0) {
      uVar1 = 0;
      do {
        this->ColorMask[uVar1] = mask;
        uVar1 = uVar1 + 1;
      } while (uVar1 < this->FrameBufferCount);
    }
    this->ColorMaskInvalid = false;
  }
  return;
}

Assistant:

void setColorMask(u8 mask)
	{
		if (ColorMask[0] != mask || ColorMaskInvalid) {
			GL.ColorMask((mask & ECP_RED) ? GL_TRUE : GL_FALSE, (mask & ECP_GREEN) ? GL_TRUE : GL_FALSE, (mask & ECP_BLUE) ? GL_TRUE : GL_FALSE, (mask & ECP_ALPHA) ? GL_TRUE : GL_FALSE);

			for (GLuint i = 0; i < FrameBufferCount; ++i)
				ColorMask[i] = mask;

			ColorMaskInvalid = false;
		}
	}